

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

void __thiscall RealTrafficConnection::tcpConnection(RealTrafficConnection *this)

{
  bool bVar1;
  logLevelTy lVar2;
  RealTrafficConnection *in_RDI;
  int in_stack_00000084;
  runtime_error *e;
  int tcpPort;
  ThreadSettings TS;
  undefined1 in_stack_000003a3;
  uint in_stack_000003a4;
  size_t in_stack_000003a8;
  int in_stack_000003b4;
  string *in_stack_000003b8;
  SocketNetworking *in_stack_000003c0;
  char *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  ThreadSettings *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uVar3;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  RealTrafficConnection *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_51;
  string local_50 [52];
  uint local_1c;
  
  ThreadSettings::ThreadSettings
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
             in_stack_ffffffffffffff18);
  in_RDI->eTcpThrStatus = THR_RUNNING;
  local_1c = DataRefs::GetCfgInt(DR_AC_KEY);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &in_RDI->tcpPosSender;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (allocator<char> *)in_stack_ffffffffffffff50);
  XPMP2::SocketNetworking::Open
            (in_stack_000003c0,in_stack_000003b8,in_stack_000003b4,in_stack_000003a8,
             in_stack_000003a4,(bool)in_stack_000003a3);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  lVar2 = DataRefs::GetLogLevel(&dataRefs);
  if ((int)lVar2 < 1) {
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
           ,0x636,"tcpConnection",logDEBUG,
           "RealTraffic: Listening on port %d for TCP connection by RealTraffic App",(ulong)local_1c
          );
  }
  bVar1 = XPMP2::TCPConnection::listenAccept((TCPConnection *)e,in_stack_00000084);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff44);
  if (bVar1) {
    lVar2 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar2 < 1) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x639,"tcpConnection",logDEBUG,
             "RealTraffic: Accepted TCP connection from RealTraffic App");
    }
    SetStatusTcp(in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f,
                 (bool)in_stack_ffffffffffffff4e);
    SendXPSimTime((RealTrafficConnection *)CONCAT44(uVar3,lVar2));
    SendUsersPlanePos(in_RDI);
  }
  else if ((int)in_RDI->eTcpThrStatus < 3) {
    lVar2 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar2 < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
             ,0x644,"tcpConnection",logERR,
             "RealTraffic: Cannot listen to network, can\'t tell RealTraffic our position");
    }
    CreateMsgWindow(12.0,logERR,
                    "RealTraffic: Cannot listen to network, can\'t tell RealTraffic our position");
    SetStatusTcp(in_stack_ffffffffffffff50,(bool)in_stack_ffffffffffffff4f,
                 (bool)in_stack_ffffffffffffff4e);
  }
  XPMP2::TCPConnection::CloseListenerOnly
            ((TCPConnection *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  in_RDI->eTcpThrStatus = THR_ENDED;
  ThreadSettings::~ThreadSettings
            ((ThreadSettings *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  return;
}

Assistant:

void RealTrafficConnection::tcpConnection ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_RT_TCP", LC_ALL_MASK);
    eTcpThrStatus = THR_RUNNING;
    
    // port to use is configurable
    int tcpPort = DataRefs::GetCfgInt(DR_CFG_RT_LISTEN_PORT);
    
    try {
        tcpPosSender.Open (RT_LOCALHOST, tcpPort, RT_NET_BUF_SIZE);
        LOG_MSG(logDEBUG, "RealTraffic: Listening on port %d for TCP connection by RealTraffic App", tcpPort);
        if (tcpPosSender.listenAccept()) {
            // so we did accept a connection!
            LOG_MSG(logDEBUG, "RealTraffic: Accepted TCP connection from RealTraffic App");
            SetStatusTcp(true, false);
            // send our simulated time and first position
            SendXPSimTime();
            SendUsersPlanePos();
        }
        else
        {
            // short-cut if we are to shut down (return from 'select' due to closed socket)
            if (eTcpThrStatus < THR_STOP) {
                // not forced to shut down...report other problem
                SHOW_MSG(logERR,ERR_RT_CANTLISTEN);
                SetStatusTcp(false, true);
            }
        }
    }
    catch (std::runtime_error& e) {
        LOG_MSG(logERR, ERR_TCP_LISTENACCEPT, ChName(),
                RT_LOCALHOST, std::to_string(tcpPort).c_str(),
                e.what());
        // invalidate the channel
        SetStatusTcp(false, true);
        SetValid(false, true);
    }
    
    // We make sure that, once leaving this thread, there is no
    // open listener (there might be a connected socket, though)
#if IBM
    if (eTcpThrStatus < THR_STOP)   // already closed if stop flag set, avoid rare crashes if called in parallel
#endif
        tcpPosSender.CloseListenerOnly();
    eTcpThrStatus = THR_ENDED;
}